

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver3L1Q<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double *this;
  double *this_00;
  double *this_01;
  double *this_02;
  double *this_03;
  double *this_04;
  double *this_05;
  double *this_06;
  double *this_07;
  double *this_08;
  double *this_09;
  double *this_10;
  double *this_11;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  size_type sVar36;
  ostream *this_12;
  reference pvVar37;
  reference pvVar38;
  Scalar *pSVar39;
  reference pvVar40;
  Scalar *pSVar41;
  CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *pCVar42;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_13;
  reference pvVar43;
  long lVar44;
  Index IVar45;
  Scalar *pSVar46;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pCVar47;
  Scalar SVar48;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar49;
  Product<Eigen::Matrix<double,_9,_6,_0,_9,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar50;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  PVar51;
  XprTypeNested local_2448;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_2440;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_2430;
  value_type local_2418;
  Type local_2390;
  non_const_type local_2358;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_2350;
  RowXpr local_2328;
  Product<Eigen::Matrix<double,_9,_6,_0,_9,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_22f0;
  Scalar local_22e0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_22d8;
  int local_22b4;
  RealScalar RStack_22b0;
  int i;
  double a;
  undefined1 local_22a0 [8];
  Matrix<double,__1,__1,_0,__1,__1> P;
  Matrix<double,_6,_1,_0,_6,_1> b_sol;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  undefined1 local_21d0 [8];
  Matrix<double,__1,_1,_0,__1,_1> b5;
  Matrix<double,__1,_1,_0,__1,_1> b4;
  Matrix<double,__1,_1,_0,__1,_1> b3;
  Matrix<double,__1,_1,_0,__1,_1> b2;
  Matrix<double,__1,_1,_0,__1,_1> b1;
  undefined1 local_2168 [8];
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  b;
  Matrix<double,9,6,0,9,6> local_2118 [8];
  Matrix<double,_9,_6,_0,_9,_6> B;
  undefined1 local_1f50 [8];
  BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> svd;
  double local_1e50;
  double local_1e48;
  double local_1e40;
  double local_1e38;
  double local_1e30;
  double local_1e28;
  double local_1e20;
  double local_1e18;
  double local_1e10;
  double local_1e08;
  double local_1e00;
  double local_1df8;
  double local_1df0;
  double local_1de8;
  double local_1de0;
  double local_1dd8;
  double local_1dd0;
  double local_1dc8;
  double local_1dc0;
  double local_1db8;
  double local_1db0;
  double local_1da8;
  double local_1da0;
  double local_1d98;
  double local_1d90;
  double local_1d88;
  CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> local_1d80;
  undefined1 local_1d60 [8];
  Matrix<double,_3,_9,_0,_3,_9> A;
  double m36;
  double m35;
  double m34;
  double m33;
  double m32;
  double m31;
  double m26;
  double m25;
  double m24;
  double m23;
  double m22;
  double m21;
  double m16;
  double m15;
  double m14;
  double m13;
  double m12;
  double m11;
  double l36;
  double l35;
  double l34;
  double l33;
  double l32;
  double l31;
  double l26;
  double l25;
  double l24;
  double l23;
  double l22;
  double l21;
  double l16;
  double l15;
  double l14;
  double l13;
  double l12;
  double l11;
  RhsNested local_1b60;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b58;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b48;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b38;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b28;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b18;
  undefined1 local_1b08 [8];
  Matrix<double,_6,_1,_0,_6,_1> M3_1;
  Matrix<double,_6,_1,_0,_6,_1> M2_1;
  Matrix<double,_6,_1,_0,_6,_1> M1_1;
  Matrix<double,_6,_1,_0,_6,_1> L3_1;
  Matrix<double,_6,_1,_0,_6,_1> L2_1;
  Matrix<double,_6,_1,_0,_6,_1> L1_1;
  Type local_19b0;
  ColXpr local_1978;
  Type local_1948;
  Matrix<double,_3,_1,_0,_3,_1> local_18e8;
  Matrix<double,_3,_3,_0,_3,_3> local_18d0;
  int local_1884;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_1880;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1858;
  Type local_17f8;
  Type local_17c0;
  Type local_1788;
  Type local_1750;
  Type local_1718;
  Type local_16e0;
  ColXpr local_16a8;
  Type local_1678;
  Matrix<double,_3,_1,_0,_3,_1> local_1618;
  Matrix<double,_3,_3,_0,_3,_3> local_1600;
  int local_15b4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_15b0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1588;
  Type local_1528;
  Type local_14f0;
  Type local_14b8;
  Type local_1480;
  undefined1 local_1448 [8];
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_1,_0,_4,_1> local_10e8;
  undefined1 local_10c8 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_1078;
  Type local_1070;
  type local_1038;
  Type local_1020;
  undefined1 local_fe8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M3;
  Type local_fa0;
  RealScalar local_f68;
  Type local_f60;
  type local_f28;
  Type local_f10;
  undefined1 local_ed8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M2;
  Type local_e90;
  RealScalar local_e58;
  Type local_e50;
  type local_e18;
  Type local_e00;
  undefined1 local_dc8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M1;
  Type local_d80;
  RealScalar local_d48;
  Type local_d40;
  type local_d08;
  Type local_cf0;
  undefined1 local_cb8 [8];
  Matrix<double,_6,_1,_0,_6,_1> L3;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c80;
  Matrix<double,3,1,0,3,1> local_c68 [8];
  Matrix<double,_3,_1,_0,_3,_1> D3;
  RealScalar local_c18;
  Type local_c10;
  type local_bd8;
  Type local_bc0;
  undefined1 local_b88 [8];
  Matrix<double,_6,_1,_0,_6,_1> L2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b50;
  Matrix<double,3,1,0,3,1> local_b38 [8];
  Matrix<double,_3,_1,_0,_3,_1> D2;
  RealScalar local_ae8;
  Type local_ae0;
  type local_aa8;
  Type local_a90;
  undefined1 local_a58 [8];
  Matrix<double,_6,_1,_0,_6,_1> L1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a20;
  Matrix<double,3,1,0,3,1> local_a08 [8];
  Matrix<double,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_9b8;
  Type local_960;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_928;
  Type local_8d0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_898;
  Type local_840;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_808;
  Type local_7b0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_778;
  Type local_720;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_6e8;
  Type local_690;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_658;
  Type local_600;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_5c8;
  Type local_570;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_538;
  Type local_4e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_4a8;
  Type local_450;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_418;
  Type local_3c0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_388;
  undefined1 local_330 [8];
  Matrix<double,_3,_1,_0,_3,_1> tQ32;
  Matrix<double,_3,_1,_0,_3,_1> tQ31;
  Matrix<double,_3,_1,_0,_3,_1> tQ22;
  Matrix<double,_3,_1,_0,_3,_1> tQ21;
  Matrix<double,_3,_1,_0,_3,_1> tQ12;
  Matrix<double,_3,_1,_0,_3,_1> tQ11;
  Matrix<double,_3,_1,_0,_3,_1> tP32;
  Matrix<double,_3,_1,_0,_3,_1> tP31;
  Matrix<double,_3,_1,_0,_3,_1> tP22;
  Matrix<double,_3,_1,_0,_3,_1> tP21;
  Matrix<double,_3,_1,_0,_3,_1> tP12;
  undefined1 local_218 [8];
  Matrix<double,_3,_1,_0,_3,_1> tP11;
  undefined1 local_1f8 [8];
  Matrix<double,_4,_1,_0,_4,_1> R32_B;
  Matrix<double,_4,_1,_0,_4,_1> R31_B;
  Matrix<double,_4,_1,_0,_4,_1> Q32;
  Matrix<double,_4,_1,_0,_4,_1> Q31;
  Matrix<double,_4,_1,_0,_4,_1> R22_B;
  Matrix<double,_4,_1,_0,_4,_1> R21_B;
  Matrix<double,_4,_1,_0,_4,_1> Q22;
  Matrix<double,_4,_1,_0,_4,_1> Q21;
  Matrix<double,_4,_1,_0,_4,_1> R12_B;
  Matrix<double,_4,_1,_0,_4,_1> R11_B;
  Matrix<double,_4,_1,_0,_4,_1> Q12;
  Matrix<double,_4,_1,_0,_4,_1> Q11;
  Matrix<double,_4,_1,_0,_4,_1> P1_B;
  Matrix<double,_4,_1,_0,_4,_1> P1;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar36 = std::
           vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ::size(ptPair);
  if (sVar36 != 0) {
    sVar36 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::size(lPair);
    if (2 < sVar36) {
      this = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
             array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this);
      this_00 = Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_00);
      this_01 = Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_01);
      this_02 = R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_02);
      this_03 = R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_03);
      this_04 = Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_04);
      this_05 = Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_05);
      this_06 = R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_06);
      this_07 = R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_07);
      this_08 = Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_08);
      this_09 = Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_09);
      this_10 = R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_10);
      this_11 = R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_11);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8);
      pvVar37 = std::
                vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ::operator[](ptPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this,&pvVar37->first);
      pvVar37 = std::
                vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ::operator[](ptPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_00,&pvVar37->second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_01,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar38);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_02,&(pvVar38->first).second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_03,&(pvVar38->second).first);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_04,&(pvVar38->second).second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_05,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar38);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_06,&(pvVar38->first).second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_07,&(pvVar38->second).first);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_08,&(pvVar38->second).second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_09,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar38);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_10,&(pvVar38->first).second);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_11,&(pvVar38->second).first);
      pvVar38 = std::
                vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8,&(pvVar38->second).second);
      tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _7_1_ = 0;
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::vector(__return_storage_ptr__);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_218);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_330);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_3c0,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_388,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_3c0,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)local_218,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_388);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_450,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_418,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_450,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_418);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_4e0,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_4a8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_4e0,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_4a8);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_570,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_538,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_570,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_538);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_600,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_5c8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_600,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_5c8);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_690,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_658,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_690,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_658);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_720,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_6e8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_720,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_6e8);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_7b0,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_778,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_7b0,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_778);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_840,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_808,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_840,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_808);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_8d0,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_898,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_8d0,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_898);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_960,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array + 3),3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                           (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_928,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_960,
                 pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_928);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                ((Type *)(D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_1f8,3);
      pSVar39 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_1f8,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_9b8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)
                 (D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),pSVar39);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)local_330,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_9b8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_a20,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_a08,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_a20);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_a58);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_a90,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_a90,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a08);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_aa8,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_ae0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_ae0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_aa8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
      local_ae8 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,&local_ae8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_b50,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_b38,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_b50);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_b88);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_bc0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_bc0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b38);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_bd8,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_c10,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_c10,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_bd8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(D3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
      local_c18 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)(D3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,&local_c18);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_c80,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_c68,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_c80);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_cb8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_cf0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_cf0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c68);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_d08,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_d40,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_d40,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_d08);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_d80,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
      local_d48 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_d80);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,&local_d48);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(M1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5),
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (local_a08,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(M1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_dc8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_e00,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_e00,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a08);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_e18,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_e50,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_e50,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e18);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_e90,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
      local_e58 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_e90);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,&local_e58);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(M2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5),
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (local_b38,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(M2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_ed8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_f10,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_f10,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b38);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_f28,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_f60,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_f60,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_f28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_fa0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
      local_f68 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_fa0);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,&local_f68);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(M3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5),(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_330,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (local_c68,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(M3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_fe8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_1020,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_1020,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c68);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_1038,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_330,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_1070,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_1070,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1038);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)&predTrans.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
      local_1078 = Eigen::
                   MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                   norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)&predTrans.
                            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,&local_1078);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                (&local_10e8,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 3));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                ((Matrix<double,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3));
      getPredefinedTransformations3L1Q<double>
                ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_10c8,&local_10e8,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf));
      pvVar40 = std::
                vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        *)local_10c8);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),pvVar40);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_10c8);
      pvVar40 = std::
                vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        *)local_10c8);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),pvVar40);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_10c8);
      Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
                ((Matrix<double,_6,_6,_0,_6,_6> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23));
      Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)local_1448);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)local_1448);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1480,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_14b8,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_14b8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1480);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_14f0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_1528,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1528,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_14f0);
      local_15b4 = -1;
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
                (&local_16a8,
                 (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_1678,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_16a8,3);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<double,3,1,0,3,1> *)&local_1618,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_1678);
      getSkew<double>(&local_1600,&local_1618);
      Eigen::operator*(&local_15b0,&local_15b4,(StorageBaseType *)&local_1600);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_16e0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
      ::operator*(&local_1588,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                   *)&local_15b0,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_16e0);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
                (&local_1718,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1718,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_1588);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1750,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_1788,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1788,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1750);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_17c0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_17f8,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_17f8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_17c0);
      local_1884 = -1;
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
                (&local_1978,
                 (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_1948,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_1978,3);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<double,3,1,0,3,1> *)&local_18e8,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_1948);
      getSkew<double>(&local_18d0,&local_18e8);
      Eigen::operator*(&local_1880,&local_1884,(StorageBaseType *)&local_18d0);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_19b0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
      ::operator*(&local_1858,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                   *)&local_1880,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_19b0);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
                ((Type *)(L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + 5),
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)
                 (L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_1858);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_1b08);
      local_1b18 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + 0x23),
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1b18);
      local_1b28 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + 0x23),
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1b28);
      local_1b38 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + 0x23),
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1b38);
      local_1b48 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1b48);
      local_1b58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1b58);
      PVar49 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                          (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8);
      local_1b60 = PVar49.m_rhs;
      l11 = (double)PVar49.m_lhs;
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)local_1b08,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&l11);
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),0);
      dVar1 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),1);
      dVar2 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),2);
      dVar3 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),3);
      dVar4 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),4);
      dVar5 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),5);
      dVar6 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),0);
      dVar7 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),1);
      dVar8 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),2);
      dVar9 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),3);
      dVar10 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),4);
      dVar11 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),5);
      dVar12 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),0);
      dVar13 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),1);
      dVar14 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),2);
      dVar15 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),3);
      dVar16 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),4);
      dVar17 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),5);
      dVar18 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),0);
      dVar19 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),1);
      dVar20 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),2);
      dVar21 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),3);
      dVar22 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),4);
      dVar23 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),5);
      dVar24 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),0);
      dVar25 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),1);
      dVar26 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),2);
      dVar27 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),3);
      dVar28 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),4);
      dVar29 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 5),5);
      dVar30 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,0)
      ;
      dVar31 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,1)
      ;
      dVar32 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,2)
      ;
      dVar33 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,3)
      ;
      dVar34 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,4)
      ;
      dVar35 = *pSVar41;
      pSVar41 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,5)
      ;
      A.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
           *pSVar41;
      Eigen::Matrix<double,_3,_9,_0,_3,_9>::Matrix((Matrix<double,_3,_9,_0,_3,_9> *)local_1d60);
      local_1d88 = dVar1 * dVar22 + dVar4 * dVar19;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator<<
                (&local_1d80,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)local_1d60,
                 &local_1d88);
      local_1d90 = dVar2 * dVar22 + dVar5 * dVar19;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (&local_1d80,&local_1d90);
      local_1d98 = dVar3 * dVar22 + dVar6 * dVar19;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1d98);
      local_1da0 = dVar1 * dVar23 + dVar4 * dVar20;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1da0);
      local_1da8 = dVar2 * dVar23 + dVar5 * dVar20;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1da8);
      local_1db0 = dVar3 * dVar23 + dVar6 * dVar20;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1db0);
      local_1db8 = dVar1 * dVar24 + dVar4 * dVar21;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1db8);
      local_1dc0 = dVar2 * dVar24 + dVar5 * dVar21;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1dc0);
      local_1dc8 = dVar3 * dVar24 + dVar6 * dVar21;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1dc8);
      local_1dd0 = dVar7 * dVar28 + dVar10 * dVar25;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1dd0);
      local_1dd8 = dVar8 * dVar28 + dVar11 * dVar25;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1dd8);
      local_1de0 = dVar9 * dVar28 + dVar12 * dVar25;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1de0);
      local_1de8 = dVar7 * dVar29 + dVar10 * dVar26;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1de8);
      local_1df0 = dVar8 * dVar29 + dVar11 * dVar26;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1df0);
      local_1df8 = dVar9 * dVar29 + dVar12 * dVar26;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1df8);
      local_1e00 = dVar7 * dVar30 + dVar10 * dVar27;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e00);
      local_1e08 = dVar8 * dVar30 + dVar11 * dVar27;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e08);
      local_1e10 = dVar9 * dVar30 + dVar12 * dVar27;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e10);
      local_1e18 = dVar13 * dVar34 + dVar16 * dVar31;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e18);
      local_1e20 = dVar14 * dVar34 + dVar17 * dVar31;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e20);
      local_1e28 = dVar15 * dVar34 + dVar18 * dVar31;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e28);
      local_1e30 = dVar13 * dVar35 + dVar16 * dVar32;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e30);
      local_1e38 = dVar14 * dVar35 + dVar17 * dVar32;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e38);
      local_1e40 = dVar15 * dVar35 + dVar18 * dVar32;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e40);
      local_1e48 = dVar13 * A.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage
                            .m_data.array[0x1a] + dVar16 * dVar33;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e48);
      local_1e50 = dVar14 * A.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage
                            .m_data.array[0x1a] + dVar17 * dVar33;
      pCVar42 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar42,&local_1e50);
      svd._240_8_ = dVar15 * A.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                             m_storage.m_data.array[0x1a] + dVar18 * dVar33;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::operator_
                (pCVar42,(Scalar *)&svd.m_numIters);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::~CommaInitializer(&local_1d80)
      ;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,3,9,0,3,9>>
                ((Matrix<double,_1,_1,0,_1,_1> *)
                 (B.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x35),(EigenBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)local_1d60);
      Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::BDCSVD
                ((BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f50,
                 (MatrixType *)
                 (B.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x35),0x14);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)
                 (B.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x35));
      this_13 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::matrixV
                          ((SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                           local_1f50);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::topRightCorner<int,int>
                ((Type *)&b.
                          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this_13,9,6);
      Eigen::Matrix<double,9,6,0,9,6>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                (local_2118,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&b.
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,9,6,0,9,6>>
                ((Matrix<double,_1,_1,0,_1,_1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,(EigenBase<Eigen::Matrix<double,_9,_6,_0,_9,_6>_> *)local_2118);
      genposeandscale_solvecoeffs<double>
                ((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_21d0);
      pvVar43 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_2168);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_21d0,pvVar43);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168);
      pvVar43 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_2168);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,pvVar43);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168);
      pvVar43 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_2168);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,pvVar43);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168);
      pvVar43 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_2168);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,pvVar43);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168);
      pvVar43 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_2168);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,pvVar43);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_2168);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (b_sol.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 &P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      a._4_4_ = 9;
      a._0_4_ = 1;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_22a0,(int *)((long)&a + 4),(int *)&a);
      local_22b4 = 0;
      while( true ) {
        lVar44 = (long)local_22b4;
        IVar45 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                            &b2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows);
        if (IVar45 <= lVar44) break;
        Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                   (b_sol.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 5),4,4);
        pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &b2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_22b4);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator<<
                  (&local_22d8,
                   (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                   &P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols,pSVar46);
        pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_22b4);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                            (&local_22d8,pSVar46);
        pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_22b4);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar47,pSVar46);
        pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_22b4);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar47,pSVar46);
        pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             local_21d0,(long)local_22b4);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar47,pSVar46);
        local_22e0 = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                  (pCVar47,&local_22e0);
        Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer
                  (&local_22d8);
        PVar50 = Eigen::MatrixBase<Eigen::Matrix<double,9,6,0,9,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,9,6,0,9,6>> *)local_2118,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            &P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols);
        local_22f0 = PVar50;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_22a0,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_9,_6,_0,_9,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_22f0);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_22a0,3,3);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_2328,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_22a0,0)
        ;
        RStack_22b0 = Eigen::
                      MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                      ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                              *)&local_2328);
        SVar48 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::determinant
                           ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_22a0);
        if (SVar48 < 0.0) {
          RStack_22b0 = -RStack_22b0;
        }
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator/
                  (&local_2350,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_22a0,
                   &stack0xffffffffffffdd50);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_22a0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_2350);
        local_2358 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_22a0);
        Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_2390,
                   (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                   (b_sol.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 5),3,3);
        Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_2390,
                   (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                   &local_2358);
        local_2448 = (XprTypeNested)
                     Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                               ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xf));
        PVar51 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                           ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                            &local_2448,
                            (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            (b_sol.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 5));
        local_2440 = PVar51;
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
        ::operator*(&local_2430,
                    (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                     *)&local_2440,
                    (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                    (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array + 0x23));
        Eigen::Matrix<double,4,4,0,4,4>::
        Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                  ((Matrix<double,4,4,0,4,4> *)&local_2418,
                   (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_2430);
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,&local_2418);
        local_22b4 = local_22b4 + 1;
      }
      tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _7_1_ = 1;
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_22a0);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_21d0)
      ;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                );
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_2168);
      Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~BDCSVD
                ((BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f50);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 *)local_10c8);
      if ((tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2]._7_1_ & 1) == 0) {
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  }
  this_12 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 point, and 3 line pairs!");
  std::ostream::operator<<(this_12,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver3L1Q(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 point, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> P1, P1_B, Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, Q31, Q32, R31_B, R32_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;

	Q11 = lPair[0].first.first; Q12 = lPair[0].first.second;
	R11_B = lPair[0].second.first; R12_B = lPair[0].second.second;
	Q21 = lPair[1].first.first; Q22 = lPair[1].first.second;
	R21_B = lPair[1].second.first; R22_B = lPair[1].second.second;
	Q31 = lPair[2].first.first; Q32 = lPair[2].first.second;
	R31_B = lPair[2].second.first; R32_B = lPair[2].second.second;


	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP11, tP12, tP21, tP22, tP31, tP32, tQ11, tQ12, tQ21, tQ22, tQ31, tQ32;
	// points first lines
	tP11 = Q11.head(3) / Q11(3);
	tP12 = Q12.head(3) / Q12(3);
	tQ11 = R11_B.head(3) / R11_B(3);
	tQ12 = R12_B.head(3) / R12_B(3);
	// points second lines
	tP21 = Q21.head(3) / Q21(3);
	tP22 = Q22.head(3) / Q22(3);
	tQ21 = R21_B.head(3) / R21_B(3);
	tQ22 = R22_B.head(3) / R22_B(3);
	// points third lines
	tP31 = Q31.head(3) / Q31(3);
	tP32 = Q32.head(3) / Q32(3);
	tQ31 = R31_B.head(3) / R31_B(3);
	tQ32 = R32_B.head(3) / R32_B(3);

	// computing the plucker coordinates of the lines
	// ref A
	Matrix<floatPrec, 3,1> D1 = tP12 - tP11;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP12.cross(tP11);
	L1 /= L1.head(3).norm();
	Matrix<floatPrec, 3,1> D2 = tP22 - tP21;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tP22.cross(tP21);
	L2 /= L2.head(3).norm();
	Matrix<floatPrec, 3,1> D3 = tP32 - tP31;
	Matrix<floatPrec, 6,1> L3;
	L3.head(3) = D3;
	L3.tail(3) = tP32.cross(tP31);
	L3 /= L3.head(3).norm();
	// ref B
	D1 = tQ12 - tQ11;
	Matrix<floatPrec, 6,1> M1;
	M1.head(3) = D1;
	M1.tail(3) = tQ12.cross(tQ11);
	M1 /= M1.head(3).norm();
	D2 = tQ22 - tQ21;
	Matrix<floatPrec, 6,1> M2;
	M2.head(3) = D2;
	M2.tail(3) = tQ22.cross(tQ21);
	M2 /= M2.head(3).norm();
	D3 = tQ32 - tQ31;
	Matrix<floatPrec, 6,1> M3;
	M3.head(3) = D3;
	M3.tail(3) = tQ32.cross(tQ31);
	M3 /= M3.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations3L1Q(P1, P1_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_1, L2_1, L3_1, M1_1, M2_1, M3_1;
	L1_1 = transLineU * L1;
	L2_1 = transLineU * L2;
	L3_1 = transLineU * L3;
	M1_1 = transLineV * M1;
	M2_1 = transLineV * M2;
	M3_1 = transLineV * M3;

	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26, l31, l32, l33, l34, l35, l36;
	l11 = L1_1[0];
	l12 = L1_1[1];
	l13 = L1_1[2];
	l14 = L1_1[3];
	l15 = L1_1[4];
	l16 = L1_1[5];
	l21 = L2_1[0];
	l22 = L2_1[1];
	l23 = L2_1[2];
	l24 = L2_1[3];
	l25 = L2_1[4];
	l26 = L2_1[5];
	l31 = L3_1[0];
	l32 = L3_1[1];
	l33 = L3_1[2];
	l34 = L3_1[3];
	l35 = L3_1[4];
	l36 = L3_1[5];
	floatPrec m11, m12, m13, m14, m15, m16, m21, m22, m23, m24, m25, m26, m31, m32, m33, m34, m35, m36;
	m11 = M1_1[0];
	m12 = M1_1[1];
	m13 = M1_1[2];
	m14 = M1_1[3];
	m15 = M1_1[4];
	m16 = M1_1[5];
	m21 = M2_1[0];
	m22 = M2_1[1];
	m23 = M2_1[2];
	m24 = M2_1[3];
	m25 = M2_1[4];
	m26 = M2_1[5];
	m31 = M3_1[0];
	m32 = M3_1[1];
	m33 = M3_1[2];
	m34 = M3_1[3];
	m35 = M3_1[4];
	m36 = M3_1[5];

	Matrix<floatPrec, 3,9> A;
	A << l11 * m14 + l14 * m11, l12 * m14 + l15 * m11, l13 * m14 + l16 * m11, l11 * m15 + l14 * m12, l12 * m15 + l15 * m12, l13 * m15 + l16 * m12, l11 * m16 + l14 * m13, l12 * m16 + l15 * m13, l13 * m16 + l16 * m13,
		l21 * m24 + l24 * m21, l22 * m24 + l25 * m21, l23 * m24 + l26 * m21, l21 * m25 + l24 * m22, l22 * m25 + l25 * m22, l23 * m25 + l26 * m22, l21 * m26 + l24 * m23, l22 * m26 + l25 * m23, l23 * m26 + l26 * m23,
		l31 * m34 + l34 * m31, l32 * m34 + l35 * m31, l33 * m34 + l36 * m31, l31 * m35 + l34 * m32, l32 * m35 + l35 * m32, l33 * m35 + l36 * m32, l31 * m36 + l34 * m33, l32 * m36 + l35 * m33, l33 * m36 + l36 * m33;

	BDCSVD<Matrix<floatPrec, Dynamic,Dynamic>> svd(A, ComputeFullU | ComputeFullV);
	Matrix<floatPrec, 9,6> B = svd.matrixV().topRightCorner(9, 6);

	vector<Matrix<floatPrec, Dynamic,1>> b = genposeandscale_solvecoeffs<floatPrec>(B);

	Matrix<floatPrec, Dynamic,1> b1, b2, b3, b4, b5;
	b5 = b.back();
	b.pop_back();
	b4 = b.back();
	b.pop_back();
	b3 = b.back();
	b.pop_back();
	b2 = b.back();
	b.pop_back();
	b1 = b.back();
	b.pop_back();

	Matrix<floatPrec, 4,4> TP;
	Matrix<floatPrec, 6,1> b_sol;
	Matrix<floatPrec, Dynamic,Dynamic> P(9,1);
	floatPrec a;
	for (int i = 0; i < b1.size(); i++)
	{
		TP.setIdentity(4,4);

		b_sol << b1[i], b2[i], b3[i], b4[i], b5[i], 1;
		
		P = B * b_sol;

		P.resize(3, 3);
		a = P.row(0).norm();

		if (P.determinant() < 0)
		{
			a = -a;
		}

		P = P / a;

		TP.topLeftCorner(3, 3) = P.transpose();

		out.push_back(TV.inverse() * TP * TU);
	}

	return out;
}